

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_24939c::Db::parseIntegerLiteral(Db *this,StringView Lit)

{
  bool bVar1;
  undefined1 local_38 [8];
  StringView Tmp;
  Db *this_local;
  StringView Lit_local;
  
  Lit_local.First = Lit.Last;
  this_local = (Db *)Lit.First;
  Tmp.Last = (char *)this;
  _local_38 = parseNumber(this,true);
  bVar1 = StringView::empty((StringView *)local_38);
  if ((bVar1) || (bVar1 = consumeIf(this,'E'), !bVar1)) {
    Lit_local.Last = (char *)0x0;
  }
  else {
    Lit_local.Last =
         (char *)(anonymous_namespace)::Db::
                 make<(anonymous_namespace)::IntegerExpr,StringView&,StringView&>
                           ((Db *)this,(StringView *)&this_local,(StringView *)local_38);
  }
  return (Node *)Lit_local.Last;
}

Assistant:

Node *Db::parseIntegerLiteral(StringView Lit) {
  StringView Tmp = parseNumber(true);
  if (!Tmp.empty() && consumeIf('E'))
    return make<IntegerExpr>(Lit, Tmp);
  return nullptr;
}